

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PrintSmartPointer<unsigned_char,std::shared_ptr<unsigned_char>,void>
               (shared_ptr<unsigned_char> *ptr,ostream *os,int param_3)

{
  ostream *poVar1;
  char *pcVar2;
  
  if ((ptr->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    pcVar2 = "(nullptr)";
  }
  else {
    poVar1 = std::operator<<(os,"(ptr = ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::operator<<(poVar1,", value = ");
    UniversalPrinter<unsigned_char>::Print
              ((ptr->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,os);
    pcVar2 = ")";
  }
  std::operator<<(os,pcVar2);
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, int) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    *os << "(ptr = " << (VoidifyPointer)(ptr.get()) << ", value = ";
    UniversalPrinter<T>::Print(*ptr, os);
    *os << ")";
  }
}